

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_SetWeapon(FParser *this)

{
  AActor *this_00;
  bool bVar1;
  int iVar2;
  char *name;
  PClassActor *type;
  AWeapon *this_01;
  AWeapon *weap;
  AInventory *item;
  int playernum;
  FParser *this_local;
  
  bVar1 = CheckArgs(this,2);
  if (bVar1) {
    iVar2 = T_GetPlayerNum(this->t_argv);
    if (iVar2 != -1) {
      this_00 = (AActor *)(&players)[(long)iVar2 * 0x54];
      name = stringvalue(this->t_argv + 1);
      type = PClass::FindActor(name);
      this_01 = (AWeapon *)AActor::FindInventory(this_00,type,false);
      if ((this_01 != (AWeapon *)0x0) &&
         (bVar1 = DObject::IsKindOf((DObject *)this_01,AWeapon::RegistrationInfo.MyClass), bVar1)) {
        if (*(AWeapon **)(&DAT_01ae7190 + (long)iVar2 * 0x2a0) == this_01) {
          *(PClass **)(&DAT_01ae7198 + (long)iVar2 * 0x2a0) = AWeapon::RegistrationInfo.MyClass;
          (this->t_return).value.i = 1;
        }
        else {
          bVar1 = AWeapon::CheckAmmo(this_01,2,false,false,-1);
          if (bVar1) {
            (this->t_return).value.i = 1;
            *(AWeapon **)(&DAT_01ae7198 + (long)iVar2 * 0x2a0) = this_01;
          }
        }
      }
    }
    (this->t_return).value.i = 0;
  }
  return;
}

Assistant:

void FParser::SF_SetWeapon()
{
	if (CheckArgs(2))
	{
		int playernum=T_GetPlayerNum(t_argv[0]);
		if (playernum!=-1) 
		{
			AInventory *item = players[playernum].mo->FindInventory (PClass::FindActor (stringvalue(t_argv[1])));

			if (item == NULL || !item->IsKindOf (RUNTIME_CLASS(AWeapon)))
			{
			}
			else if (players[playernum].ReadyWeapon == item)
			{
				// The weapon is already selected, so setweapon succeeds by default,
				// but make sure the player isn't switching away from it.
				players[playernum].PendingWeapon = WP_NOCHANGE;
				t_return.value.i = 1;
			}
			else
			{
				AWeapon *weap = static_cast<AWeapon *> (item);

				if (weap->CheckAmmo (AWeapon::EitherFire, false))
				{
					// There's enough ammo, so switch to it.
					t_return.value.i = 1;
					players[playernum].PendingWeapon = weap;
				}
			}
		}
		t_return.value.i = 0;
	}
}